

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O2

void __thiscall
QBlitterPaintEnginePrivate::fillRect
          (QBlitterPaintEnginePrivate *this,QRectF *rect,QColor *color,bool alpha)

{
  QPaintEngine *this_00;
  qreal qVar1;
  qreal qVar2;
  CompositionMode CVar3;
  int iVar4;
  int iVar5;
  QClipData *pQVar6;
  const_iterator this_01;
  const_iterator pQVar7;
  QBlittable *pQVar8;
  QPaintDevice *pQVar9;
  _func_int **pp_Var10;
  QPaintEngineState *pQVar11;
  QRectF *pQVar12;
  QRectF *pQVar13;
  QRect *rect_1;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  QRectF local_98;
  undefined1 local_78 [16];
  double local_68;
  double local_60;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QRasterPaintEnginePrivate).super_QPaintEngineExPrivate.
            super_QPaintEnginePrivate.q_ptr;
  local_58.xp = rect->xp;
  local_58.yp = rect->yp;
  local_58.w = rect->w;
  local_58.h = rect->h;
  if (this->hasXForm != 0) {
    pQVar11 = this_00->state + -2;
    if (this_00->state == (QPaintEngineState *)0x0) {
      pQVar11 = (QPaintEngineState *)0x0;
    }
    QTransform::mapRect(&local_58,(QTransform *)(pQVar11 + 0x36),rect);
  }
  pQVar6 = QRasterPaintEnginePrivate::clip(&this->super_QRasterPaintEnginePrivate);
  qVar1 = local_58.w;
  if (pQVar6 == (QClipData *)0x0) {
    if ((local_58.xp < 0.0) || (local_58.yp < 0.0)) {
LAB_0036b9e5:
      pQVar9 = QPaintEngine::paintDevice(this_00);
      iVar4 = (*pQVar9->_vptr_QPaintDevice[4])(pQVar9,1);
      pQVar9 = QPaintEngine::paintDevice(this_00);
      iVar5 = (*pQVar9->_vptr_QPaintDevice[4])(pQVar9,2);
      local_60 = (double)iVar5;
      local_78 = ZEXT816(0);
      local_68 = (double)iVar4;
      unlock(this);
      pQVar8 = QBlittablePlatformPixmap::blittable(this->pmData);
      if (!alpha) {
        pQVar12 = &local_98;
        pQVar13 = (QRectF *)local_78;
        goto LAB_0036bb17;
      }
      pQVar12 = &local_98;
      pQVar13 = (QRectF *)local_78;
      goto LAB_0036baaf;
    }
    pQVar9 = QPaintEngine::paintDevice(this_00);
    iVar4 = (*pQVar9->_vptr_QPaintDevice[4])(pQVar9,1);
    qVar2 = local_58.h;
    if ((double)iVar4 < qVar1) goto LAB_0036b9e5;
    pQVar9 = QPaintEngine::paintDevice(this_00);
    iVar4 = (*pQVar9->_vptr_QPaintDevice[4])(pQVar9,2);
    if ((double)iVar4 < qVar2) goto LAB_0036b9e5;
    unlock(this);
    pQVar8 = QBlittablePlatformPixmap::blittable(this->pmData);
    if (!alpha) {
      pp_Var10 = pQVar8->_vptr_QBlittable;
      pQVar12 = &local_58;
      goto LAB_0036bb25;
    }
    pQVar11 = this_00->state + -2;
    if (this_00->state == (QPaintEngineState *)0x0) {
      pQVar11 = (QPaintEngineState *)0x0;
    }
    CVar3 = QPaintEngineState::compositionMode(pQVar11 + 2);
    pp_Var10 = pQVar8->_vptr_QBlittable;
    pQVar12 = &local_58;
  }
  else {
    if ((pQVar6->field_0x48 & 2) == 0) {
      if ((pQVar6->field_0x48 & 4) != 0) {
        this_01 = QRegion::begin(&pQVar6->clipRegion);
        pQVar7 = QRegion::end(&pQVar6->clipRegion);
        for (; this_01 != pQVar7; this_01 = this_01 + 1) {
          local_78 = (undefined1  [16])QRectF::toRect(&local_58);
          auVar14 = QRect::operator&(this_01,(QRect *)local_78);
          iVar4 = auVar14._0_4_;
          if (auVar14._4_4_ <= auVar14._12_4_ && iVar4 <= auVar14._8_4_) {
            unlock(this);
            pQVar8 = QBlittablePlatformPixmap::blittable(this->pmData);
            local_78._8_8_ = (undefined8)auVar14._4_4_;
            local_68 = (double)(((long)auVar14._8_4_ - (long)iVar4) + 1);
            local_60 = (double)(((auVar14._8_8_ >> 0x20) - (auVar14._0_8_ >> 0x20)) + 1);
            if (alpha) {
              local_78._0_8_ = (double)iVar4;
              pQVar11 = this_00->state + -2;
              if (this_00->state == (QPaintEngineState *)0x0) {
                pQVar11 = (QPaintEngineState *)0x0;
              }
              CVar3 = QPaintEngineState::compositionMode(pQVar11 + 2);
              (*pQVar8->_vptr_QBlittable[4])(pQVar8,local_78,color,(ulong)CVar3);
            }
            else {
              local_78._0_8_ = (double)iVar4;
              (*pQVar8->_vptr_QBlittable[2])(pQVar8,local_78,color);
            }
          }
        }
      }
      goto LAB_0036bb2d;
    }
    unlock(this);
    pQVar8 = QBlittablePlatformPixmap::blittable(this->pmData);
    if (!alpha) {
      QRectF::QRectF(&local_98,&pQVar6->clipRect);
      pQVar12 = (QRectF *)local_78;
      pQVar13 = &local_58;
LAB_0036bb17:
      QRectF::operator&(pQVar12,(QRectF *)pQVar13);
      pp_Var10 = pQVar8->_vptr_QBlittable;
LAB_0036bb25:
      (*pp_Var10[2])(pQVar8,pQVar12,color);
      goto LAB_0036bb2d;
    }
    QRectF::QRectF(&local_98,&pQVar6->clipRect);
    pQVar12 = (QRectF *)local_78;
    pQVar13 = &local_58;
LAB_0036baaf:
    QRectF::operator&(pQVar12,(QRectF *)pQVar13);
    pQVar11 = this_00->state + -2;
    if (this_00->state == (QPaintEngineState *)0x0) {
      pQVar11 = (QPaintEngineState *)0x0;
    }
    CVar3 = QPaintEngineState::compositionMode(pQVar11 + 2);
    pp_Var10 = pQVar8->_vptr_QBlittable;
  }
  (*pp_Var10[4])(pQVar8,pQVar12,color,(ulong)CVar3);
LAB_0036bb2d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBlitterPaintEnginePrivate::fillRect(const QRectF &rect, const QColor &color, bool alpha)
{
    Q_Q(QBlitterPaintEngine);
    pmData->unmarkRasterOverlay(rect);
    QRectF targetRect = rect;
    if (hasXForm)
        targetRect = q->state()->matrix.mapRect(rect);
    const QClipData *clipData = clip();
    if (clipData) {
        if (clipData->hasRectClip) {
            unlock();
            if (alpha)
                pmData->blittable()->alphaFillRect(targetRect & clipData->clipRect, color, q->state()->compositionMode());
            else
                pmData->blittable()->fillRect(targetRect & clipData->clipRect, color);
        } else if (clipData->hasRegionClip) {
            for (const QRect &rect : clipData->clipRegion) {
                QRect intersectRect = rect.intersected(targetRect.toRect());
                if (!intersectRect.isEmpty()) {
                    unlock();
                    if (alpha)
                        pmData->blittable()->alphaFillRect(intersectRect, color, q->state()->compositionMode());
                    else
                        pmData->blittable()->fillRect(intersectRect, color);
                }
            }
        }
    } else {
        if (targetRect.x() >= 0 && targetRect.y() >= 0
            && targetRect.width() <= q->paintDevice()->width()
            && targetRect.height() <= q->paintDevice()->height()) {
            unlock();
            if (alpha)
                pmData->blittable()->alphaFillRect(targetRect, color, q->state()->compositionMode());
            else
                pmData->blittable()->fillRect(targetRect, color);
        } else {
            QRectF deviceRect(0, 0, q->paintDevice()->width(), q->paintDevice()->height());
            unlock();
            if (alpha)
                pmData->blittable()->alphaFillRect(deviceRect & targetRect, color, q->state()->compositionMode());
            else
                pmData->blittable()->fillRect(deviceRect & targetRect, color);
        }
    }
}